

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

void Js::JavascriptArray::ConcatArgs<unsigned_int>
               (RecyclableObject *pDestObj,TypeId *remoteTypeIds,Arguments *args,
               ScriptContext *scriptContext,uint start,uint startIdxDest,
               ConcatSpreadableState previousItemSpreadableState,BigIndex *firstPromotedItemLength)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  BOOL BVar4;
  uint32 uVar5;
  int succeeded;
  undefined4 *puVar6;
  Var pvVar7;
  JavascriptArray *pJVar8;
  RecyclableObject *object;
  uint64 uVar9;
  undefined4 in_register_00000084;
  ulong uVar10;
  Arguments *this;
  uint32 index;
  ulong uVar11;
  char cVar12;
  bool bVar13;
  BigIndex BVar14;
  PropertyRecord *local_d0;
  PropertyRecord *propertyRecord;
  ScriptContext *local_c0;
  RecyclableObject *local_b8;
  undefined4 *local_b0;
  ulong local_a8;
  Arguments *local_a0;
  undefined1 auStack_98 [8];
  BigIndex length;
  undefined1 auStack_78 [8];
  BigIndex idxSubItem;
  undefined1 local_60 [8];
  JsReentLock jsReentLock;
  
  uVar10 = CONCAT44(in_register_00000084,start);
  uVar11 = (ulong)startIdxDest;
  local_60 = (undefined1  [8])scriptContext->threadContext;
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  jsReentLock.m_arrayObject2._0_1_ = ((ThreadContext *)local_60)->noJsReentrancy;
  ((ThreadContext *)local_60)->noJsReentrancy = true;
  local_c0 = (ScriptContext *)remoteTypeIds;
  local_a0 = args;
  idxSubItem.bigIndex._4_4_ = start;
  bVar2 = IsNonES5Array(pDestObj);
  if (bVar2) {
    jsReentLock._24_8_ = UnsafeVarTo<Js::JavascriptArray>(pDestObj);
  }
  else {
    jsReentLock._24_8_ = (JavascriptArray *)0x0;
  }
  if ((JavascriptArray *)jsReentLock._24_8_ == (JavascriptArray *)0x0) {
    jsReentLock.m_savedNoJsReentrancy = false;
    jsReentLock._25_7_ = 0;
  }
  else {
    EnsureNonNativeArray((JavascriptArray *)jsReentLock._24_8_);
    remoteTypeIds = (TypeId *)jsReentLock._24_8_;
    JsReentLock::setSecondObjectForMutation((JsReentLock *)local_60,(Var)jsReentLock._24_8_);
  }
  if (((scriptContext->config).threadConfig)->m_ES6IsConcatSpreadable == false) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    remoteTypeIds = (TypeId *)0xcb4;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0xcb4,
                                "(scriptContext->GetConfig()->IsES6IsConcatSpreadableEnabled())",
                                "scriptContext->GetConfig()->IsES6IsConcatSpreadableEnabled()");
    if (!bVar2) {
LAB_00b9814f:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
  }
  this = local_a0;
  uVar3 = *(uint *)&local_a0->Info & 0xffffff;
  bVar2 = idxSubItem.bigIndex._4_4_ < uVar3;
  if (idxSubItem.bigIndex._4_4_ < uVar3) {
    local_b0 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    remoteTypeIds = (TypeId *)(ulong)idxSubItem.bigIndex._4_4_;
    local_b8 = pDestObj;
    do {
      idxSubItem.bigIndex._4_4_ = (uint)remoteTypeIds;
      pvVar7 = Arguments::operator[](this,idxSubItem.bigIndex._4_4_);
      JsReentLock::setObjectForMutation((JsReentLock *)local_60,pvVar7);
      bVar13 = previousItemSpreadableState == ConcatSpreadableState_CheckedAndTrue;
      if (previousItemSpreadableState == ConcatSpreadableState_NotChecked) {
        *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
        BVar4 = JavascriptOperators::IsConcatSpreadable(pvVar7);
        JsReentLock::MutateArrayObject((JsReentLock *)local_60);
        bVar13 = BVar4 != 0;
        *(bool *)((long)local_60 + 0x108) = true;
      }
      uVar3 = (uint)uVar11;
      if (bVar13) {
        if (((jsReentLock._24_8_ != 0) && (bVar13 = IsDirectAccessArray(pvVar7), bVar13)) &&
           (bVar13 = IsDirectAccessArray((Var)jsReentLock._24_8_), bVar13)) {
          pJVar8 = UnsafeVarTo<Js::JavascriptArray>(pvVar7);
          BigIndex::BigIndex((BigIndex *)auStack_78,(pJVar8->super_ArrayObject).length + uVar3);
          if (auStack_78._0_4_ != 0xffffffff) {
            pJVar8 = UnsafeVarTo<Js::JavascriptArray>(pvVar7);
            bVar13 = IsFillFromPrototypes(pJVar8);
            if (!bVar13) {
              bVar13 = VarIs<Js::JavascriptNativeIntArray>(pvVar7);
              if (bVar13) {
                pJVar8 = (JavascriptArray *)UnsafeVarTo<Js::JavascriptNativeIntArray>(pvVar7);
              }
              else {
                pJVar8 = (JavascriptArray *)0x0;
              }
              if (pJVar8 == (JavascriptArray *)0x0) {
                bVar13 = VarIs<Js::JavascriptNativeFloatArray>(pvVar7);
                if (bVar13) {
                  pJVar8 = (JavascriptArray *)UnsafeVarTo<Js::JavascriptNativeFloatArray>(pvVar7);
                }
                else {
                  pJVar8 = (JavascriptArray *)0x0;
                }
                if (pJVar8 == (JavascriptArray *)0x0) {
                  pJVar8 = UnsafeVarTo<Js::JavascriptArray>(pvVar7);
                  *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
                  BigIndex::BigIndex((BigIndex *)auStack_78,uVar3);
                  uVar5 = BigIndex::GetSmallIndex((BigIndex *)auStack_78);
                  remoteTypeIds = (TypeId *)(ulong)uVar5;
                  uVar10 = 0xffffffff;
                  CopyArrayElements((JavascriptArray *)jsReentLock._24_8_,uVar5,pJVar8,0,0xffffffff)
                  ;
                  JsReentLock::MutateArrayObject((JsReentLock *)local_60);
                }
                else {
                  *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
                  BigIndex::BigIndex((BigIndex *)auStack_78,uVar3);
                  uVar5 = BigIndex::GetSmallIndex((BigIndex *)auStack_78);
                  remoteTypeIds = (TypeId *)(ulong)uVar5;
                  uVar10 = 0xffffffff;
                  CopyNativeFloatArrayElementsToVar
                            ((JavascriptArray *)jsReentLock._24_8_,uVar5,
                             (JavascriptNativeFloatArray *)pJVar8,0,0xffffffff);
                }
              }
              else {
                *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
                BigIndex::BigIndex((BigIndex *)auStack_78,uVar3);
                uVar5 = BigIndex::GetSmallIndex((BigIndex *)auStack_78);
                remoteTypeIds = (TypeId *)(ulong)uVar5;
                uVar10 = 0xffffffff;
                CopyNativeIntArrayElementsToVar
                          ((JavascriptArray *)jsReentLock._24_8_,uVar5,
                           (JavascriptNativeIntArray *)pJVar8,0,0xffffffff);
              }
              *(bool *)((long)local_60 + 0x108) = true;
              uVar11 = (ulong)(uVar3 + (pJVar8->super_ArrayObject).length);
              cVar12 = '\0';
              firstPromotedItemLength = (BigIndex *)0x0;
              goto LAB_00b97f76;
            }
          }
        }
        bVar13 = VarIs<Js::RecyclableObject>(pvVar7);
        if (!bVar13) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *local_b0 = 1;
          bVar13 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                       ,0xce8,"(VarIs<RecyclableObject>(aItem))",
                                       "VarIs<RecyclableObject>(aItem)");
          if (!bVar13) goto LAB_00b9814f;
          *local_b0 = 0;
        }
        BigIndex::BigIndex((BigIndex *)auStack_98,0);
        if (firstPromotedItemLength == (BigIndex *)0x0) {
          *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
          uVar9 = OP_GetLength(pvVar7,scriptContext);
          BigIndex::BigIndex((BigIndex *)auStack_78,uVar9);
          auStack_98 = (undefined1  [8])CONCAT44(auStack_78._4_4_,auStack_78._0_4_);
          length.index = idxSubItem.index;
          length._4_4_ = idxSubItem._4_4_;
          JsReentLock::MutateArrayObject((JsReentLock *)local_60);
          *(bool *)((long)local_60 + 0x108) = true;
        }
        else {
          auStack_98 = *(undefined1 (*) [8])firstPromotedItemLength;
          length._0_8_ = firstPromotedItemLength->bigIndex;
        }
        auStack_78._0_4_ = auStack_98._0_4_;
        idxSubItem.index = length.index;
        idxSubItem._4_4_ = length._4_4_;
        if (auStack_98._0_4_ == 0xffffffff) {
          cVar12 = true;
        }
        else {
          uVar5 = BigIndex::GetSmallIndex((BigIndex *)auStack_78);
          cVar12 = CARRY4(uVar5,uVar3);
        }
        if ((bool)cVar12 == false) {
          BVar14 = BigIndex::operator+((BigIndex *)auStack_98,uVar3);
          idxSubItem._0_8_ = BVar14.bigIndex;
          auStack_78._0_4_ = BVar14.index;
          BigIndex::BigIndex((BigIndex *)&stack0xffffffffffffff30,0x1fffffffffffff);
          bVar13 = BigIndex::operator>((BigIndex *)auStack_78,(BigIndex *)&stack0xffffffffffffff30);
          if (bVar13) {
            JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec09,(PCWSTR)0x0);
          }
          object = VarTo<Js::RecyclableObject>(pvVar7);
          local_a8 = uVar11;
          if (auStack_98._0_4_ == 0xffffffff) {
            uVar5 = 0xffffffff;
          }
          else {
            uVar5 = BigIndex::GetSmallIndex((BigIndex *)auStack_98);
          }
          uVar11 = local_a8;
          if (uVar5 != 0) {
            index = 0;
            do {
              *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
              BVar4 = JavascriptOperators::HasItem(object,index);
              JsReentLock::MutateArrayObject((JsReentLock *)local_60);
              *(bool *)((long)local_60 + 0x108) = true;
              if (BVar4 != 0) {
                *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
                pvVar7 = JavascriptOperators::GetItem(object,index,scriptContext);
                JsReentLock::MutateArrayObject((JsReentLock *)local_60);
                uVar3 = (int)local_a8 + index;
                *(bool *)((long)local_60 + 0x108) = true;
                if (jsReentLock._24_8_ == 0) {
                  *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
                  succeeded = (*(local_b8->super_FinalizableObject).super_IRecyclerVisitedObject.
                                _vptr_IRecyclerVisitedObject[0x29])(local_b8,(ulong)uVar3,pvVar7,4);
                  ThrowErrorOnFailure(succeeded,scriptContext,uVar3);
                  JsReentLock::MutateArrayObject((JsReentLock *)local_60);
                  *(bool *)((long)local_60 + 0x108) = true;
                }
                else {
                  pvVar7 = CrossSite::MarshalVar
                                     (*(ScriptContext **)
                                       (*(long *)(*(long *)(jsReentLock._24_8_ + 8) + 8) + 0x490),
                                      pvVar7,false);
                  DirectSetItemAt<void*>((JavascriptArray *)jsReentLock._24_8_,uVar3,pvVar7);
                }
              }
              index = index + 1;
            } while (uVar5 != index);
            pDestObj = local_b8;
            uVar11 = (ulong)((int)local_a8 + index);
          }
          BigIndex::BigIndex((BigIndex *)auStack_78,0xffffffff);
          while( true ) {
            remoteTypeIds = (TypeId *)auStack_98;
            bVar13 = BigIndex::operator<((BigIndex *)auStack_78,(BigIndex *)remoteTypeIds);
            if (!bVar13) break;
            uVar9 = BigIndex::GetBigIndex((BigIndex *)auStack_78);
            JavascriptOperators::GetPropertyIdForInt(uVar9,scriptContext,&stack0xffffffffffffff30);
            *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
            BVar4 = JavascriptOperators::HasProperty(object,local_d0->pid);
            JsReentLock::MutateArrayObject((JsReentLock *)local_60);
            *(bool *)((long)local_60 + 0x108) = true;
            if (BVar4 != 0) {
              *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
              pvVar7 = JavascriptOperators::GetProperty
                                 (object,local_d0->pid,scriptContext,(PropertyValueInfo *)0x0);
              JsReentLock::MutateArrayObject((JsReentLock *)local_60);
              *(bool *)((long)local_60 + 0x108) = true;
              if (jsReentLock._24_8_ == 0) {
                *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
                uVar3 = (*(pDestObj->super_FinalizableObject).super_IRecyclerVisitedObject.
                          _vptr_IRecyclerVisitedObject[0x29])(pDestObj,uVar11 & 0xffffffff,pvVar7,4)
                ;
                BVar14.bigIndex = uVar10;
                BVar14.index = idxSubItem.index;
                BVar14._4_4_ = idxSubItem._4_4_;
                ThrowErrorOnFailure((JavascriptArray *)(ulong)uVar3,(BOOL)scriptContext,
                                    (ScriptContext *)(ulong)(uint)auStack_78._0_4_,BVar14);
                JsReentLock::MutateArrayObject((JsReentLock *)local_60);
                *(bool *)((long)local_60 + 0x108) = true;
              }
              else {
                pvVar7 = CrossSite::MarshalVar
                                   (*(ScriptContext **)
                                     (*(long *)(*(long *)(jsReentLock._24_8_ + 8) + 8) + 0x490),
                                    pvVar7,false);
                DirectSetItemAt<void*>((JavascriptArray *)jsReentLock._24_8_,(uint32)uVar11,pvVar7);
              }
            }
            if (auStack_78._0_4_ == 0xffffffff) {
              idxSubItem._0_8_ = idxSubItem._0_8_ + 1;
            }
            else {
              auStack_78._0_4_ = auStack_78._0_4_ + 1;
            }
            uVar11 = (ulong)((uint32)uVar11 + 1);
          }
          firstPromotedItemLength = (BigIndex *)0x0;
        }
        else {
          *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
          uVar10 = (ulong)idxSubItem.bigIndex._4_4_;
          remoteTypeIds = (TypeId *)local_c0;
          ConcatArgs<Js::JavascriptArray::BigIndex>
                    (pDestObj,(TypeId *)local_c0,local_a0,scriptContext,idxSubItem.bigIndex._4_4_,
                     uVar3,ConcatSpreadableState_CheckedAndTrue,(BigIndex *)auStack_98);
          JsReentLock::MutateArrayObject((JsReentLock *)local_60);
          *(bool *)((long)local_60 + 0x108) = true;
        }
      }
      else {
        *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
        remoteTypeIds = (TypeId *)(ulong)idxSubItem.bigIndex._4_4_;
        uVar10 = uVar11 & 0xffffffff;
        SetConcatItem<unsigned_int>
                  (pvVar7,idxSubItem.bigIndex._4_4_,(JavascriptArray *)jsReentLock._24_8_,pDestObj,
                   uVar3,scriptContext);
        JsReentLock::MutateArrayObject((JsReentLock *)local_60);
        *(bool *)((long)local_60 + 0x108) = true;
        uVar11 = (ulong)(uVar3 + 1);
        cVar12 = '\x06';
      }
LAB_00b97f76:
      if ((cVar12 != '\x06') && (cVar12 != '\0')) break;
      remoteTypeIds = (TypeId *)(ulong)(idxSubItem.bigIndex._4_4_ + 1);
      previousItemSpreadableState = ConcatSpreadableState_NotChecked;
      bVar2 = idxSubItem.bigIndex._4_4_ + 1 < (*(uint *)&local_a0->Info & 0xffffff);
      this = local_a0;
    } while (bVar2);
  }
  if (!bVar2) {
    uVar5 = (uint32)uVar11;
    if (jsReentLock._24_8_ == 0) {
      *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      pvVar7 = ConvertToIndex<unsigned_int,void*>(uVar5,(ScriptContext *)remoteTypeIds);
      (*(pDestObj->super_FinalizableObject).super_IRecyclerVisitedObject.
        _vptr_IRecyclerVisitedObject[0x17])(pDestObj,0xd1,pvVar7,0,0);
      JsReentLock::MutateArrayObject((JsReentLock *)local_60);
      *(bool *)((long)local_60 + 0x108) = true;
    }
    else if (*(uint32 *)(jsReentLock._24_8_ + 0x20) != uVar5) {
      SetLength((JavascriptArray *)jsReentLock._24_8_,uVar5);
    }
  }
  *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  return;
}

Assistant:

void JavascriptArray::ConcatArgs(RecyclableObject* pDestObj, TypeId* remoteTypeIds,
        Js::Arguments& args, ScriptContext* scriptContext, uint start, uint startIdxDest,
        ConcatSpreadableState previousItemSpreadableState /*= ConcatSpreadableState_NotChecked*/, BigIndex *firstPromotedItemLength /* = nullptr */)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        JavascriptArray* pDestArray = JavascriptArray::TryVarToNonES5Array(pDestObj);
        if (pDestArray)
        {
            // ConcatArgs function expects to work on the Var array so we are ensuring it.
            pDestArray = EnsureNonNativeArray(pDestArray);
            SET_SECOND_OBJECT_FOR_MUTATION(jsReentLock, pDestArray);
        }

        AssertOrFailFast(scriptContext->GetConfig()->IsES6IsConcatSpreadableEnabled()); // ConcatSpreadable is enabled already - not going back.

        T idxDest = startIdxDest;
        for (uint idxArg = start; idxArg < args.Info.Count; idxArg++)
        {
            Var aItem = args[idxArg];
            SETOBJECT_FOR_MUTATION(jsReentLock, aItem);

            bool spreadable = previousItemSpreadableState == ConcatSpreadableState_CheckedAndTrue;

            if (previousItemSpreadableState == ConcatSpreadableState_NotChecked)
            {
                JS_REENTRANT(jsReentLock, spreadable = !!JavascriptOperators::IsConcatSpreadable(aItem));
            }

            // Reset the state for the next item in the array
            previousItemSpreadableState = ConcatSpreadableState_NotChecked;

            if (!spreadable)
            {
                JS_REENTRANT(jsReentLock, JavascriptArray::SetConcatItem<T>(aItem, idxArg, pDestArray, pDestObj, idxDest, scriptContext));
                ++idxDest;
                continue;
            }

            if (pDestArray && JavascriptArray::IsDirectAccessArray(aItem) && JavascriptArray::IsDirectAccessArray(pDestArray)
                && BigIndex(idxDest + UnsafeVarTo<JavascriptArray>(aItem)->length).IsSmallIndex() && !UnsafeVarTo<JavascriptArray>(aItem)->IsFillFromPrototypes()) // Fast path
            {
                JavascriptNativeIntArray *pIntItemArray = JavascriptOperators::TryFromVar<JavascriptNativeIntArray>(aItem);
                if (pIntItemArray)
                {
                    JS_REENTRANT_NO_MUTATE(jsReentLock, CopyNativeIntArrayElementsToVar(pDestArray, BigIndex(idxDest).GetSmallIndex(), pIntItemArray));
                    idxDest = idxDest + pIntItemArray->length;
                }
                else
                {
                    JavascriptNativeFloatArray *pFloatItemArray = JavascriptOperators::TryFromVar<JavascriptNativeFloatArray>(aItem);
                    if (pFloatItemArray)
                    {
                        JS_REENTRANT_NO_MUTATE(jsReentLock, CopyNativeFloatArrayElementsToVar(pDestArray, BigIndex(idxDest).GetSmallIndex(), pFloatItemArray));
                        idxDest = idxDest + pFloatItemArray->length;
                    }
                    else
                    {
                        JavascriptArray* pItemArray = UnsafeVarTo<JavascriptArray>(aItem);
                        JS_REENTRANT(jsReentLock, CopyArrayElements(pDestArray, BigIndex(idxDest).GetSmallIndex(), pItemArray));
                        idxDest = idxDest + pItemArray->length;
                    }
                }
            }
            else
            {
                AssertOrFailFast(VarIs<RecyclableObject>(aItem));

                //CONSIDER: enumerating remote array instead of walking all indices
                BigIndex length;
                if (firstPromotedItemLength != nullptr)
                {
                    length = *firstPromotedItemLength;
                }
                else
                {
                    JS_REENTRANT(jsReentLock, length = OP_GetLength(aItem, scriptContext));
                }

                if (PromoteToBigIndex(length, idxDest))
                {
                    // This is a special case for spreadable objects. We do not pre-calculate the length
                    // in EntryConcat like we do with Arrays because a getProperty on an object Length
                    // is observable. The result is we have to check for overflows separately for
                    // spreadable objects and promote to a bigger index type when we find them.
                    JS_REENTRANT(jsReentLock, ConcatArgs<BigIndex>(pDestObj, remoteTypeIds, args, scriptContext, idxArg, idxDest, ConcatSpreadableState_CheckedAndTrue, &length));
                    return;
                }

                if (length + idxDest > FiftyThirdPowerOfTwoMinusOne) // 2^53-1: from ECMA 22.1.3.1 Array.prototype.concat(...arguments)
                {
                    JavascriptError::ThrowTypeError(scriptContext, JSERR_IllegalArraySizeAndLength);
                }

                RecyclableObject* itemObject = VarTo<RecyclableObject>(aItem);
                Var subItem;
                uint32 lengthToUin32Max = length.IsSmallIndex() ? length.GetSmallIndex() : MaxArrayLength;
                for (uint32 idxSubItem = 0u; idxSubItem < lengthToUin32Max; ++idxSubItem)
                {
                    JS_REENTRANT(jsReentLock, BOOL hasItem = JavascriptOperators::HasItem(itemObject, idxSubItem));
                    if (hasItem)
                    {
                        JS_REENTRANT(jsReentLock, subItem = JavascriptOperators::GetItem(itemObject, idxSubItem, scriptContext));

                        if (pDestArray)
                        {
                            pDestArray->GenericDirectSetItemAt(idxDest, subItem);
                        }
                        else
                        {
                            JS_REENTRANT(jsReentLock, ThrowErrorOnFailure(SetArrayLikeObjects(pDestObj, idxDest, subItem), scriptContext, idxDest));
                        }
                    }
                    ++idxDest;
                }

                for (BigIndex idxSubItem = MaxArrayLength; idxSubItem < length; ++idxSubItem)
                {
                    PropertyRecord const * propertyRecord;
                    JavascriptOperators::GetPropertyIdForInt(idxSubItem.GetBigIndex(), scriptContext, &propertyRecord);
                    JS_REENTRANT(jsReentLock, BOOL hasProp = JavascriptOperators::HasProperty(itemObject, propertyRecord->GetPropertyId()));
                    if (hasProp)
                    {
                        JS_REENTRANT(jsReentLock, subItem = JavascriptOperators::GetProperty(itemObject, propertyRecord->GetPropertyId(), scriptContext));
                        if (pDestArray)
                        {
                            pDestArray->GenericDirectSetItemAt(idxDest, subItem);
                        }
                        else
                        {
                            JS_REENTRANT(jsReentLock, ThrowErrorOnFailure(SetArrayLikeObjects(pDestObj, idxDest, subItem), scriptContext, idxSubItem));
                        }
                    }
                    ++idxDest;
                }
            }

            firstPromotedItemLength = nullptr;
        }

        if (!pDestArray)
        {
            JS_REENTRANT(jsReentLock, pDestObj->SetProperty(PropertyIds::length, ConvertToIndex<T, Var>(idxDest, scriptContext), Js::PropertyOperation_None, nullptr));
        }
        else if (pDestArray->GetLength() != ConvertToIndex<T, uint32>(idxDest, scriptContext))
        {
            pDestArray->SetLength(ConvertToIndex<T, uint32>(idxDest, scriptContext));
        }
    }